

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O3

int ChecksumLength(ChecksumType method)

{
  int iVar1;
  
  iVar1 = 0;
  if (method - Constant_8C15 < 6) {
    iVar1 = *(int *)(&DAT_001adf20 + (ulong)(method - Constant_8C15) * 4);
  }
  return iVar1;
}

Assistant:

int ChecksumLength(ChecksumType method)
{
    switch (method)
    {
    case ChecksumType::None:
        break;
    case ChecksumType::Sum_1800:
    case ChecksumType::XOR_1800:
    case ChecksumType::XOR_18A0:
        return 1;
    case ChecksumType::Constant_8C15:
    case ChecksumType::CRC_D2F6_1800:
    case ChecksumType::CRC_D2F6_1802:
        return 2;
    }

    return 0;
}